

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ImFontAtlas(ImFontAtlas *this)

{
  ImVec2 local_24 [2];
  ImFontAtlas *local_10;
  ImFontAtlas *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->TexUvWhitePixel);
  ImVector<ImFont_*>::ImVector(&this->Fonts);
  ImVector<ImFontAtlas::CustomRect>::ImVector(&this->CustomRects);
  ImVector<ImFontConfig>::ImVector(&this->ConfigData);
  this->TexID = (ImTextureID)0x0;
  this->TexPixelsAlpha8 = (uchar *)0x0;
  this->TexPixelsRGBA32 = (uint *)0x0;
  this->TexDesiredWidth = 0;
  this->TexHeight = 0;
  this->TexWidth = 0;
  this->TexGlyphPadding = 1;
  ImVec2::ImVec2(local_24,0.0,0.0);
  this->TexUvWhitePixel = local_24[0];
  return;
}

Assistant:

ImFontAtlas::ImFontAtlas()
{
    TexID = NULL;
    TexPixelsAlpha8 = NULL;
    TexPixelsRGBA32 = NULL;
    TexWidth = TexHeight = TexDesiredWidth = 0;
    TexGlyphPadding = 1;
    TexUvWhitePixel = ImVec2(0, 0);
}